

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::OperatorPerformanceCase::prepareNextRound
          (OperatorPerformanceCase *this)

{
  int iVar1;
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
  *this_00;
  bool bVar2;
  State SVar3;
  reference pvVar4;
  MessageBuilder *pMVar5;
  InternalError *this_01;
  reference pvVar6;
  size_type sVar7;
  reference this_02;
  float fVar8;
  float fVar9;
  int local_264;
  WorkloadRecord local_200;
  int local_1e0;
  int local_1dc;
  int workload;
  int highWorkload;
  MessageBuilder local_1a8;
  int local_24;
  reference pvStack_20;
  int workloadSize;
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
  *records;
  TestLog *log;
  OperatorPerformanceCase *this_local;
  
  log = (TestLog *)this;
  records = (vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
             *)tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  if ((this->m_state == STATE_CALIBRATING) &&
     (SVar3 = deqp::gls::TheilSenCalibrator::getState(&this->m_calibrator), SVar3 == STATE_FINISHED)
     ) {
    this->m_measureProgramNdx = 0;
    this->m_state = STATE_FIND_HIGH_WORKLOAD;
  }
  if (this->m_state == STATE_CALIBRATING) {
    prepareWorkload(this,0,1);
  }
  else if (this->m_state == STATE_FIND_HIGH_WORKLOAD) {
    pvStack_20 = std::
                 vector<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
                 ::operator[](&this->m_workloadRecordsFindHigh,(long)this->m_measureProgramNdx);
    bVar2 = std::
            vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
            ::empty(pvStack_20);
    if (!bVar2) {
      pvVar4 = std::
               vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
               ::back(pvStack_20);
      fVar8 = WorkloadRecord::getMedianTime(pvVar4);
      pvVar4 = std::
               vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
               ::operator[](pvStack_20,0);
      fVar9 = WorkloadRecord::getMedianTime(pvVar4);
      if (fVar9 * 2.0 <= fVar8) {
        pvVar4 = std::
                 vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                 ::back(pvStack_20);
        iVar1 = pvVar4->workloadSize;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->m_highWorkloadSizes,(long)this->m_measureProgramNdx);
        *pvVar6 = iVar1;
        this->m_measureProgramNdx = this->m_measureProgramNdx + 1;
        iVar1 = this->m_measureProgramNdx;
        sVar7 = std::
                vector<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                ::size(&this->m_programs);
        if ((int)sVar7 <= iVar1) {
          this->m_state = STATE_MEASURING;
          this->m_workloadNdx = -1;
          this->m_measureProgramNdx = 0;
        }
        prepareProgram(this,this->m_measureProgramNdx);
        prepareNextRound(this);
        return;
      }
    }
    bVar2 = std::
            vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
            ::empty(pvStack_20);
    if (bVar2) {
      local_24 = 1;
    }
    else {
      pvVar4 = std::
               vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
               ::back(pvStack_20);
      local_24 = pvVar4->workloadSize << 1;
      if (0x20000000 < local_24) {
        tcu::TestLog::operator<<
                  (&local_1a8,(TestLog *)records,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [20])"Even workload size ");
        pvVar4 = std::
                 vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                 ::back(pvStack_20);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&pvVar4->workloadSize);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(char (*) [50])
                                   " doesn\'t give high enough frame time for program ");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&this->m_measureProgramNdx);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [29])0x2b96c28);
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1a8);
        this_01 = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::InternalError::InternalError
                  (this_01,"Unable to get sensible measurements for estimation",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
                   ,0x2ce);
        __cxa_throw(this_01,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
      }
    }
    this_00 = pvStack_20;
    WorkloadRecord::WorkloadRecord((WorkloadRecord *)&workload,local_24);
    std::
    vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
    ::push_back(this_00,(WorkloadRecord *)&workload);
    WorkloadRecord::~WorkloadRecord((WorkloadRecord *)&workload);
    prepareWorkload(this,0,local_24);
    this->m_workloadMeasurementNdx = 0;
  }
  else {
    this->m_workloadNdx = this->m_workloadNdx + 1;
    if (this->m_workloadNdx < this->m_numWorkloads) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->m_highWorkloadSizes,(long)this->m_measureProgramNdx);
      local_1dc = *pvVar6;
      if (this->m_numWorkloads < local_1dc) {
        local_264 = (this->m_workloadNdx * (local_1dc + -1)) / (this->m_numWorkloads + -1);
      }
      else {
        local_264 = this->m_workloadNdx;
      }
      local_264 = local_264 + 1;
      local_1e0 = local_264;
      prepareWorkload(this,this->m_measureProgramNdx,local_264);
      this->m_workloadMeasurementNdx = 0;
      this_02 = std::
                vector<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
                ::operator[](&this->m_workloadRecords,(long)this->m_measureProgramNdx);
      WorkloadRecord::WorkloadRecord(&local_200,local_1e0);
      std::
      vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
      ::push_back(this_02,&local_200);
      WorkloadRecord::~WorkloadRecord(&local_200);
    }
    else {
      this->m_measureProgramNdx = this->m_measureProgramNdx + 1;
      iVar1 = this->m_measureProgramNdx;
      sVar7 = std::
              vector<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
              ::size(&this->m_programs);
      if (iVar1 < (int)sVar7) {
        this->m_workloadNdx = -1;
        this->m_workloadMeasurementNdx = 0;
        prepareProgram(this,this->m_measureProgramNdx);
        prepareNextRound(this);
      }
      else {
        this->m_state = STATE_REPORTING;
      }
    }
  }
  return;
}

Assistant:

void OperatorPerformanceCase::prepareNextRound (void)
{
	DE_ASSERT(m_state == STATE_CALIBRATING			||
			  m_state == STATE_FIND_HIGH_WORKLOAD	||
			  m_state == STATE_MEASURING);

	TestLog& log = m_testCtx.getLog();

	if (m_state == STATE_CALIBRATING && m_calibrator.getState() == TheilSenCalibrator::STATE_FINISHED)
	{
		m_measureProgramNdx = 0;
		m_state = STATE_FIND_HIGH_WORKLOAD;
	}

	if (m_state == STATE_CALIBRATING)
		prepareWorkload(0, 1);
	else if (m_state == STATE_FIND_HIGH_WORKLOAD)
	{
		vector<WorkloadRecord>& records = m_workloadRecordsFindHigh[m_measureProgramNdx];

		if (records.empty() || records.back().getMedianTime() < 2.0f*records[0].getMedianTime())
		{
			int workloadSize;

			if (records.empty())
				workloadSize = 1;
			else
			{
				workloadSize = records.back().workloadSize*2;

				if (workloadSize > MAX_WORKLOAD_SIZE)
				{
					log << TestLog::Message << "Even workload size " << records.back().workloadSize
											<< " doesn't give high enough frame time for program " << m_measureProgramNdx
											<< ". Can't get sensible result." << TestLog::EndMessage;
					MEASUREMENT_FAIL();
				}
			}

			records.push_back(WorkloadRecord(workloadSize));
			prepareWorkload(0, workloadSize);
			m_workloadMeasurementNdx = 0;
		}
		else
		{
			m_highWorkloadSizes[m_measureProgramNdx] = records.back().workloadSize;
			m_measureProgramNdx++;

			if (m_measureProgramNdx >= (int)m_programs.size())
			{
				m_state = STATE_MEASURING;
				m_workloadNdx = -1;
				m_measureProgramNdx = 0;
			}

			prepareProgram(m_measureProgramNdx);
			prepareNextRound();
		}
	}
	else
	{
		m_workloadNdx++;

		if (m_workloadNdx < m_numWorkloads)
		{
			DE_ASSERT(m_numWorkloads > 1);
			const int highWorkload	= m_highWorkloadSizes[m_measureProgramNdx];
			const int workload		= highWorkload > m_numWorkloads ?
										1 + m_workloadNdx*(highWorkload-1)/(m_numWorkloads-1) :
										1 + m_workloadNdx;

			prepareWorkload(m_measureProgramNdx, workload);

			m_workloadMeasurementNdx = 0;

			m_workloadRecords[m_measureProgramNdx].push_back(WorkloadRecord(workload));
		}
		else
		{
			m_measureProgramNdx++;

			if (m_measureProgramNdx < (int)m_programs.size())
			{
				m_workloadNdx = -1;
				m_workloadMeasurementNdx = 0;
				prepareProgram(m_measureProgramNdx);
				prepareNextRound();
			}
			else
				m_state = STATE_REPORTING;
		}
	}
}